

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O2

bool __thiscall pg::SSPMSolver::lift(SSPMSolver *this,int v,int target,int *str,int pl)

{
  uint uVar1;
  Game *pGVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  bool bVar8;
  char *pcVar9;
  long lVar10;
  int *piVar11;
  ulong uVar12;
  _label_vertex local_48;
  int *local_38;
  
  lVar10 = (long)v;
  if (this->pm_d[this->l * lVar10] != -1) {
    uVar1 = ((this->super_Solver).game)->_priority[lVar10];
    iVar6 = this->h + -1 + (int)(uVar1 + (pl == 0)) / -2;
    local_38 = str;
    if (1 < (this->super_Solver).trace) {
      poVar7 = std::operator<<((this->super_Solver).logger,"\x1b[37;1mupdating vertex ");
      local_48.g = (this->super_Solver).game;
      local_48.v = v;
      poVar7 = operator<<(poVar7,&local_48);
      poVar7 = std::operator<<(poVar7," (");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar1);
      poVar7 = std::operator<<(poVar7," => ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
      poVar7 = std::operator<<(poVar7,")");
      iVar3 = Solver::owner(&this->super_Solver,v);
      pcVar9 = " (odd)";
      if (iVar3 == 0) {
        pcVar9 = " (even)";
      }
      poVar7 = std::operator<<(poVar7,pcVar9);
      std::operator<<(poVar7,"\x1b[m with current measure");
      stream_pm(this,(this->super_Solver).logger,v);
      std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
    }
    iVar3 = Solver::owner(&this->super_Solver,v);
    if ((target == -1) || (iVar3 != pl)) {
      pGVar2 = (this->super_Solver).game;
      bVar8 = true;
      piVar11 = pGVar2->_outedges + pGVar2->_firstouts[lVar10];
      while( true ) {
        iVar3 = *piVar11;
        uVar12 = (ulong)iVar3;
        if (uVar12 == 0xffffffffffffffff) break;
        if ((((this->super_Solver).disabled)->_bits[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) == 0) {
          to_tmp(this,iVar3);
          if (1 < (this->super_Solver).trace) {
            poVar7 = std::operator<<((this->super_Solver).logger,"to successor ");
            local_48.g = (this->super_Solver).game;
            local_48.v = iVar3;
            poVar7 = operator<<(poVar7,&local_48);
            std::operator<<(poVar7," from");
            stream_tmp(this,(this->super_Solver).logger,this->h);
            std::operator<<((this->super_Solver).logger," =>");
          }
          if ((uVar1 & 1) == pl) {
            prog_tmp(this,iVar6,this->h);
          }
          else {
            trunc_tmp(this,iVar6);
          }
          if (1 < (this->super_Solver).trace) {
            stream_tmp(this,(this->super_Solver).logger,this->h);
            std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
          }
          if (bVar8) {
LAB_00160eac:
            tmp_to_best(this);
            *local_38 = iVar3;
          }
          else {
            iVar4 = Solver::owner(&this->super_Solver,v);
            iVar5 = compare(this,iVar6);
            if (iVar4 == pl) {
              if (0 < iVar5) goto LAB_00160eac;
            }
            else if (iVar5 < 0) goto LAB_00160eac;
          }
          bVar8 = false;
        }
        piVar11 = piVar11 + 1;
      }
      to_tmp(this,v);
      iVar6 = compare(this,iVar6);
      if (iVar6 < 0) {
        if (0 < (this->super_Solver).trace) {
          poVar7 = std::operator<<((this->super_Solver).logger,
                                   "\x1b[1;32mnew measure\x1b[m of \x1b[36;1m");
          local_48.g = (this->super_Solver).game;
          local_48.v = v;
          poVar7 = operator<<(poVar7,&local_48);
          std::operator<<(poVar7,"\x1b[m:");
          stream_best(this,(this->super_Solver).logger,this->h);
          poVar7 = std::operator<<((this->super_Solver).logger," (to ");
          local_48.g = (this->super_Solver).game;
          local_48.v = *local_38;
          poVar7 = operator<<(poVar7,&local_48);
          std::operator<<(poVar7,")\n");
        }
        from_best(this,v);
        return true;
      }
    }
    else {
      to_tmp(this,target);
      if ((uVar1 & 1) == pl) {
        prog_tmp(this,iVar6,this->h);
      }
      else {
        trunc_tmp(this,iVar6);
      }
      to_best(this,v);
      iVar3 = compare(this,iVar6);
      if (0 < iVar3) {
        from_tmp(this,v);
        if (1 < (this->super_Solver).trace) {
          poVar7 = std::operator<<((this->super_Solver).logger,"to successor ");
          local_48.g = (this->super_Solver).game;
          local_48.v = target;
          poVar7 = operator<<(poVar7,&local_48);
          std::operator<<(poVar7,":");
          stream_tmp(this,(this->super_Solver).logger,this->h);
          std::operator<<((this->super_Solver).logger," =>");
        }
        if ((uVar1 & 1) == pl) {
          prog_tmp(this,iVar6,this->h);
        }
        else {
          trunc_tmp(this,iVar6);
        }
        iVar6 = (this->super_Solver).trace;
        if (1 < iVar6) {
          stream_tmp(this,(this->super_Solver).logger,this->h);
          std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
          iVar6 = (this->super_Solver).trace;
        }
        if (iVar6 < 1) {
          return true;
        }
        poVar7 = std::operator<<((this->super_Solver).logger,
                                 "\x1b[32;1mnew measure\x1b[m of \x1b[36;1m");
        local_48.g = (this->super_Solver).game;
        local_48.v = v;
        poVar7 = operator<<(poVar7,&local_48);
        std::operator<<(poVar7,"\x1b[m:");
        stream_tmp(this,(this->super_Solver).logger,this->h);
        poVar7 = std::operator<<((this->super_Solver).logger," (to ");
        local_48.g = (this->super_Solver).game;
        local_48.v = target;
        poVar7 = operator<<(poVar7,&local_48);
        std::operator<<(poVar7,")\n");
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool
SSPMSolver::lift(int v, int target, int &str, int pl)
{
    // check if already Top
    if (pm_d[l*v] == -1) return false; // already Top

    const int pr = priority(v);
    const int pindex = pl == 0 ? h-(pr+1)/2-1 : h-pr/2-1;

#ifndef NDEBUG
    if (trace >= 2) {
        logger << "\033[37;1mupdating vertex " << label_vertex(v) << " (" << pr << " => " << pindex << ")" << (owner(v)?" (odd)":" (even)") << "\033[m with current measure";
        stream_pm(logger, v);
        logger << std::endl;
    }
#endif

    // if even owns and target is set, just check if specific target is better
    if (owner(v) == pl and target != -1) {
        to_tmp(target);
        if (pl == (pr&1)) prog_tmp(pindex, h);
        else trunc_tmp(pindex);
        to_best(v);
        if (compare(pindex) > 0) {
            from_tmp(v);
#ifndef NDEBUG
            if (trace >= 2) {
                logger << "to successor " << label_vertex(target) << ":";
                stream_tmp(logger, h);
                logger << " =>";
            }
#endif
            if (pl == (pr&1)) prog_tmp(pindex, h);
            else trunc_tmp(pindex);
#ifndef NDEBUG
            if (trace >= 2) {
                stream_tmp(logger, h);
                logger << std::endl;
            }
#endif
#ifndef NDEBUG
            if (trace >= 1) {
                logger << "\033[32;1mnew measure\033[m of \033[36;1m" << label_vertex(v) << "\033[m:";
                stream_tmp(logger, h);
                logger << " (to " << label_vertex(target) << ")\n";
            }
#endif
            return true;
        } else {
            return false;
        }
    }

    // compute best measure
    bool first = true;
    for (auto curedge = outs(v); *curedge != -1; curedge++) {
        int to = *curedge;
        if (disabled[to]) continue;
        to_tmp(to);
#ifndef NDEBUG
        if (trace >= 2) {
            logger << "to successor " << label_vertex(to) << " from";
            stream_tmp(logger, h);
            logger << " =>";
        }
#endif
        if (pl == (pr&1)) prog_tmp(pindex, h);
        else trunc_tmp(pindex);
#ifndef NDEBUG
        if (trace >= 2) {
            stream_tmp(logger, h);
            logger << std::endl;
        }
#endif
        if (first) {
            tmp_to_best();
            str = to;
        } else if (owner(v) == pl) {
            // we want the max!
            if (compare(pindex) > 0) {
                tmp_to_best();
                str = to;
            }
        } else {
            // we want the min!
            if (compare(pindex) < 0) {
                tmp_to_best();
                str = to;
            }
        }
        first = false;
    }

    // set best to pm if higher
    to_tmp(v);
    if (compare(pindex) < 0) {
#ifndef NDEBUG
        if (trace >= 1) {
            logger << "\033[1;32mnew measure\033[m of \033[36;1m" << label_vertex(v) << "\033[m:";
            stream_best(logger, h);
            logger << " (to " << label_vertex(str) << ")\n";
        }
#endif
        from_best(v);
        return true;
    } else {
        return false;
    }
}